

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.h
# Opt level: O2

void __thiscall
lossless_neural_sound::audio::File_input_stream::File_input_stream
          (File_input_stream *this,char *file_name)

{
  ifstream *this_00;
  Audio_error *this_01;
  error_category *peVar1;
  error_code ec;
  
  (this->super_Rewindable_input_stream).super_Input_stream._vptr_Input_stream =
       (_func_int **)&PTR__File_input_stream_00105cd0;
  this_00 = &this->is;
  std::ifstream::ifstream(this_00);
  std::ios::exceptions((int)*(undefined8 *)(*(long *)&this->is + -0x18) + (int)this_00);
  std::ifstream::open((char *)this_00,(_Ios_Openmode)file_name);
  if (((&this->field_0x28)[*(long *)(*(long *)this_00 + -0x18)] & 5) == 0) {
    return;
  }
  this_01 = (Audio_error *)__cxa_allocate_exception(0x20);
  peVar1 = (error_category *)std::_V2::generic_category();
  ec._M_cat = peVar1;
  ec._0_8_ = 2;
  Audio_error::Audio_error(this_01,ec,"open failed");
  __cxa_throw(this_01,&Audio_error::typeinfo,std::system_error::~system_error);
}

Assistant:

explicit File_input_stream(const char *file_name) : is()
    {
        is.exceptions(std::ios::badbit);
        is.open(file_name, std::ios::binary);
        if(!is)
            throw Audio_error(make_error_code(std::errc::no_such_file_or_directory), "open failed");
    }